

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O3

int __thiscall KParser::_call(KParser *this,int begin,BlockInfo *bi)

{
  pointer pTVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  string rightValue;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  char local_a0 [16];
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  char local_60 [16];
  string local_50;
  
  pTVar1 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1[begin].tokenType != id) {
    return -1;
  }
  if (pTVar1[(long)begin + 1].tokenType != lparen) {
    return -1;
  }
  if (pTVar1[(long)begin + 2].tokenType == rparen) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"call","");
    pTVar1 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    _Var2._M_p = pTVar1[begin].str._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,_Var2._M_p,_Var2._M_p + pTVar1[begin].str._M_string_length);
    puVar6 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&this->m_funcToParams,
                                  &(this->m_tokens).
                                   super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                   super__Vector_impl_data._M_start[begin].str);
    uVar4 = *puVar6;
    uVar5 = -uVar4;
    if (0 < (int)uVar4) {
      uVar5 = uVar4;
    }
    uVar12 = 1;
    if (9 < uVar5) {
      uVar9 = (ulong)uVar5;
      uVar11 = 4;
      do {
        uVar12 = uVar11;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_0010bf3e;
        }
        if (uVar7 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_0010bf3e;
        }
        if (uVar7 < 10000) goto LAB_0010bf3e;
        uVar9 = uVar9 / 10000;
        uVar11 = uVar12 + 4;
      } while (99999 < uVar7);
      uVar12 = uVar12 + 1;
    }
LAB_0010bf3e:
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_130,(char)uVar12 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_130._M_dataplus._M_p + (uVar4 >> 0x1f),uVar12,uVar5);
    addCode(this,&local_f0,&local_110,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    return begin + 3;
  }
  local_90._0_8_ = local_90 + 0x10;
  pcVar3 = (bi->sLabel)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar3,pcVar3 + (bi->sLabel)._M_string_length);
  pcVar3 = (bi->eLabel)._M_dataplus._M_p;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (bi->eLabel)._M_string_length);
  uVar4 = _expr(this,begin + 2,(BlockInfo *)local_90);
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  if ((int)uVar4 < 0) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,anon_var_dwarf_16501,anon_var_dwarf_16501 + 0x31);
    addErrorString(this,begin + 2,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) {
      return -1;
    }
  }
  else {
    do {
      pTVar1 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      _Var2._M_p = pTVar1[uVar4].str._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,_Var2._M_p,_Var2._M_p + pTVar1[uVar4].str._M_string_length);
      iVar10 = 3;
      if ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4].tokenType == comma) {
        pcVar3 = (bi->sLabel)._M_dataplus._M_p;
        local_d0._0_8_ = local_d0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,pcVar3,pcVar3 + (bi->sLabel)._M_string_length);
        local_b0._M_p = local_a0;
        pcVar3 = (bi->eLabel)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar3,pcVar3 + (bi->eLabel)._M_string_length);
        uVar5 = _expr(this,uVar4 + 1,(BlockInfo *)local_d0);
        if (local_b0._M_p != local_a0) {
          operator_delete(local_b0._M_p);
        }
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_);
        }
        if ((int)uVar5 < 0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,anon_var_dwarf_1650d,anon_var_dwarf_1650d + 0x29);
          addErrorString(this,uVar4,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          iVar10 = 1;
        }
        else {
          iVar10 = 0;
          uVar4 = uVar5;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
    } while (iVar10 == 0);
    if (iVar10 != 3) {
      return -1;
    }
    if ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4].tokenType == rparen) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"call","");
      pTVar1 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      _Var2._M_p = pTVar1[begin].str._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,_Var2._M_p,_Var2._M_p + pTVar1[begin].str._M_string_length);
      puVar6 = (uint *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&this->m_funcToParams,
                                    &(this->m_tokens).
                                     super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                     super__Vector_impl_data._M_start[begin].str);
      uVar5 = *puVar6;
      uVar12 = -uVar5;
      if (0 < (int)uVar5) {
        uVar12 = uVar5;
      }
      uVar11 = 1;
      if (9 < uVar12) {
        uVar9 = (ulong)uVar12;
        uVar7 = 4;
        do {
          uVar11 = uVar7;
          uVar8 = (uint)uVar9;
          if (uVar8 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_0010c008;
          }
          if (uVar8 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_0010c008;
          }
          if (uVar8 < 10000) goto LAB_0010c008;
          uVar9 = uVar9 / 10000;
          uVar7 = uVar11 + 4;
        } while (99999 < uVar8);
        uVar11 = uVar11 + 1;
      }
LAB_0010c008:
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_190,(char)uVar11 - (char)((int)uVar5 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_190._M_dataplus._M_p + (uVar5 >> 0x1f),uVar11,uVar12);
      addCode(this,&local_150,&local_170,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
        return uVar4 + 1;
      }
      return uVar4 + 1;
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,anon_var_dwarf_16519,anon_var_dwarf_16519 + 0x1d);
    addErrorString(this,uVar4,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) {
      return -1;
    }
  }
  operator_delete(local_1b0._M_dataplus._M_p);
  return -1;
}

Assistant:

int KParser::_call(int begin,  BlockInfo bi) {
    // some();
    // some(a);
    // some(a,b,c);
    int i = begin;
    int t = 0;

    // 인자가 없는 경우 
    if (m_tokens[i].tokenType == TokenType::id && 
        m_tokens[i + 1].tokenType == TokenType::lparen && 
        m_tokens[i + 2].tokenType == TokenType::rparen
        ) {
        addCode("call", m_tokens[i].str,  std::to_string( m_funcToParams[m_tokens[i].str]));
        return i + 3;
    }

    // 인자가 하나이상 있는 경우
    if (m_tokens[i].tokenType == TokenType::id && 
        m_tokens[i + 1].tokenType == TokenType::lparen) {
        i = i + 2;
        // 이 까지 왔으면 매개변수가 하나이상 있는 것이다.
        t = _expr(i, bi);
        if (t < 0) {
            addErrorString(i, "함수 인자에는 표현식이 와야합니다.");
            return -1;
        }
        i = t;

        while (1) {
            int tryI = i;
            std::string rightValue = m_tokens[tryI].str;
            TokenType tokenValue = m_tokens[tryI].tokenType;
            if(tokenValue != TokenType::comma) {
                break;
            }
            tryI++;
            t = _expr(tryI, bi);
            if (t < 0) {
                addErrorString(i, ", 뒤에 표현식을 기대했습니다.");
                return -1; 
            }
            tryI = t;
            i = tryI;
        } 
        if (m_tokens[i].tokenType != TokenType::rparen) {
            addErrorString(i, "_call: ) 가 빠졌습니다.");
            return -1;
        }
        i++;
        addCode("call", m_tokens[begin].str,  std::to_string( m_funcToParams[m_tokens[begin].str]));
        return i;
    }

    return -1; 
}